

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_valueConstructorConstRvalue_Test
          (optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [&]() -> const opt_type { return opt_type{this->value_1}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(this->value_1, *make());
  EXPECT_EQ(this->value_1, make().value());
  EXPECT_EQ(this->value_1, make().value_or(this->value_2));
}